

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O0

bool __thiscall Sandbox::haveChange(Sandbox *this)

{
  bool bVar1;
  bool local_11;
  Sandbox *this_local;
  
  local_11 = true;
  if ((this->m_change & 1U) == 0) {
    bVar1 = isRecording();
    local_11 = true;
    if (!bVar1) {
      bVar1 = std::operator!=(&this->screenshotFile,"");
      local_11 = true;
      if (!bVar1) {
        bVar1 = SceneRender::haveChange(&this->m_sceneRender);
        local_11 = true;
        if (!bVar1) {
          local_11 = Uniforms::haveChange(&this->uniforms);
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool Sandbox::haveChange() { 
    return  m_change ||
            isRecording() ||
            screenshotFile != "" ||
            m_sceneRender.haveChange() ||
            uniforms.haveChange();
}